

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_filter_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4045ec::AV1HighbdSelfguidedFilterTest_DISABLED_SpeedTest_Test::TestBody
          (AV1HighbdSelfguidedFilterTest_DISABLED_SpeedTest_Test *this)

{
  int bit_depth;
  uint16_t *puVar1;
  uint16_t *puVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  int iVar5;
  ParamType *pPVar6;
  ostream *poVar7;
  ulong uVar8;
  uint16_t *puVar9;
  uint16_t *puVar10;
  pointer *__ptr;
  uint16_t *puVar11;
  uint16_t *puVar12;
  uint uVar13;
  SEARCH_METHODS *pSVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  AssertionResult gtest_ar_3;
  aom_usec_timer tst_timer;
  aom_usec_timer ref_timer;
  AssertHelper local_88;
  int32_t *tmpbuf;
  ACMRandom rnd;
  int64_t ref_time;
  uint16_t *output_;
  uint16_t *input_;
  int xqd [2];
  int64_t tst_time;
  
  pPVar6 = testing::
           WithParamInterface<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>_>
           ::GetParam();
  (this->super_AV1HighbdSelfguidedFilterTest).tst_fun_ =
       (SgrFunc)(pPVar6->
                super__Tuple_impl<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>
                ).
                super__Head_base<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_false>
                ._M_head_impl;
  pPVar6 = testing::
           WithParamInterface<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>_>
           ::GetParam();
  bit_depth = (pPVar6->
              super__Tuple_impl<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>
              ).super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  input_ = (uint16_t *)aom_memalign(0x20,0x28800);
  tst_timer.begin.tv_sec = 0;
  testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
            ((internal *)&ref_timer,"input_","nullptr",&input_,(void **)&tst_timer);
  if ((char)ref_timer.begin.tv_sec == '\0') {
    testing::Message::Message((Message *)&tst_timer);
    if (ref_timer.begin.tv_usec == 0) {
      pSVar14 = "";
    }
    else {
      pSVar14 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
               ,0xff,(char *)pSVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tst_timer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (tst_timer.begin.tv_sec != 0) {
      (**(code **)(*(long *)tst_timer.begin.tv_sec + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ref_timer.begin.tv_usec);
    output_ = (uint16_t *)aom_memalign(0x20,0x28800);
    tst_timer.begin.tv_sec = 0;
    testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
              ((internal *)&ref_timer,"output_","nullptr",&output_,(void **)&tst_timer);
    if ((char)ref_timer.begin.tv_sec == '\0') {
      testing::Message::Message((Message *)&tst_timer);
      if (ref_timer.begin.tv_usec == 0) {
        pSVar14 = "";
      }
      else {
        pSVar14 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                 ,0x102,(char *)pSVar14);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tst_timer);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
      if (tst_timer.begin.tv_sec != 0) {
        (**(code **)(*(long *)tst_timer.begin.tv_sec + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ref_timer.begin.tv_usec);
      tmpbuf = (int32_t *)aom_memalign(0x20,0x13b9a0);
      tst_timer.begin.tv_sec = 0;
      testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                ((internal *)&ref_timer,"tmpbuf","nullptr",&tmpbuf,(void **)&tst_timer);
      if ((char)ref_timer.begin.tv_sec != '\0') {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&ref_timer.begin.tv_usec);
        puVar2 = input_;
        puVar1 = output_;
        rnd.random_.state_ = (Random)0xbaba;
        puVar9 = input_;
        for (lVar17 = -0x10; lVar17 != 0x110; lVar17 = lVar17 + 1) {
          for (lVar16 = 0; lVar16 != 0x120; lVar16 = lVar16 + 1) {
            uVar3 = libaom_test::ACMRandom::Rand16(&rnd);
            puVar9[lVar16] = uVar3 & ~(ushort)(-1 << ((byte)bit_depth & 0x1f));
          }
          puVar9 = puVar9 + 0x120;
        }
        uVar4 = testing::internal::Random::Generate(&rnd.random_,0x80);
        xqd[0] = uVar4 - 0x60;
        uVar4 = testing::internal::Random::Generate(&rnd.random_,0x80);
        xqd[1] = uVar4 - 0x20;
        av1_loop_restoration_precal();
        ::aom_usec_timer_start(&ref_timer);
        for (iVar5 = 0; iVar5 != 2000; iVar5 = iVar5 + 1) {
          puVar9 = puVar1 + 0x1210;
          puVar11 = puVar2 + 0x1210;
          for (uVar8 = 0; uVar8 < 0x100; uVar8 = uVar8 + 0x40) {
            uVar15 = 0x100 - (int)uVar8;
            if (0x3f < uVar15) {
              uVar15 = 0x40;
            }
            uVar19 = 0x100;
            puVar10 = puVar9;
            puVar12 = puVar11;
            for (uVar18 = 0; uVar18 < 0x100; uVar18 = uVar18 + 0x40) {
              uVar13 = 0x40;
              if (uVar19 < 0x40) {
                uVar13 = uVar19;
              }
              av1_apply_selfguided_restoration_c
                        ((uint8_t *)((ulong)puVar12 >> 1),uVar13,uVar15,0x120,0xf,xqd,
                         (uint8_t *)((ulong)puVar10 >> 1),0x120,tmpbuf,bit_depth,1);
              puVar10 = puVar10 + 0x40;
              puVar12 = puVar12 + 0x40;
              uVar19 = uVar19 - 0x40;
            }
            puVar9 = puVar9 + 0x4800;
            puVar11 = puVar11 + 0x4800;
          }
        }
        ::aom_usec_timer_mark(&ref_timer);
        ref_time = ::aom_usec_timer_elapsed(&ref_timer);
        ::aom_usec_timer_start(&tst_timer);
        for (iVar5 = 0; iVar5 != 2000; iVar5 = iVar5 + 1) {
          puVar9 = puVar1 + 0x1210;
          puVar11 = puVar2 + 0x1210;
          for (uVar8 = 0; uVar8 < 0x100; uVar8 = uVar8 + 0x40) {
            uVar15 = 0x100 - (int)uVar8;
            if (0x3f < uVar15) {
              uVar15 = 0x40;
            }
            uVar19 = 0x100;
            puVar10 = puVar9;
            puVar12 = puVar11;
            for (uVar18 = 0; uVar18 < 0x100; uVar18 = uVar18 + 0x40) {
              uVar13 = 0x40;
              if (uVar19 < 0x40) {
                uVar13 = uVar19;
              }
              (*(this->super_AV1HighbdSelfguidedFilterTest).tst_fun_)
                        ((uint8_t *)((ulong)puVar12 >> 1),uVar13,uVar15,0x120,0xf,xqd,
                         (uint8_t *)((ulong)puVar10 >> 1),0x120,tmpbuf,bit_depth,1);
              puVar10 = puVar10 + 0x40;
              puVar12 = puVar12 + 0x40;
              uVar19 = uVar19 - 0x40;
            }
            puVar9 = puVar9 + 0x4800;
            puVar11 = puVar11 + 0x4800;
          }
        }
        ::aom_usec_timer_mark(&tst_timer);
        tst_time = ::aom_usec_timer_elapsed(&tst_timer);
        poVar7 = std::operator<<((ostream *)&std::cout,"[          ] C time = ");
        poVar7 = std::ostream::_M_insert<long>((long)poVar7);
        poVar7 = std::operator<<(poVar7," ms, SIMD time = ");
        poVar7 = std::ostream::_M_insert<long>((long)poVar7);
        std::operator<<(poVar7," ms\n");
        testing::internal::CmpHelperGT<long,long>
                  ((internal *)&gtest_ar_3,"ref_time","tst_time",&ref_time,&tst_time);
        if (gtest_ar_3.success_ == false) {
          testing::Message::Message((Message *)&local_118);
          std::operator<<((ostream *)(local_118._M_head_impl + 0x10),
                          "Error: AV1HighbdSelfguidedFilterTest.SpeedTest, SIMD slower than C.\n");
          std::operator<<((ostream *)(local_118._M_head_impl + 0x10),"C time: ");
          std::ostream::_M_insert<long>((long)(local_118._M_head_impl + 0x10));
          std::operator<<((ostream *)(local_118._M_head_impl + 0x10)," us\n");
          std::operator<<((ostream *)(local_118._M_head_impl + 0x10),"SIMD time: ");
          std::ostream::_M_insert<long>((long)(local_118._M_head_impl + 0x10));
          std::operator<<((ostream *)(local_118._M_head_impl + 0x10)," us\n");
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_3.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar14 = "";
          }
          else {
            pSVar14 = *(SEARCH_METHODS **)
                       gtest_ar_3.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                     ,0x13d,(char *)pSVar14);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_118);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_118._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_118._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_3.message_);
        aom_free(input_);
        aom_free(output_);
        aom_free(tmpbuf);
        return;
      }
      testing::Message::Message((Message *)&tst_timer);
      if (ref_timer.begin.tv_usec == 0) {
        pSVar14 = "";
      }
      else {
        pSVar14 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                 ,0x104,(char *)pSVar14);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tst_timer);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
      if (tst_timer.begin.tv_sec != 0) {
        (**(code **)(*(long *)tst_timer.begin.tv_sec + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ref_timer.begin.tv_usec);
  return;
}

Assistant:

TEST_P(AV1HighbdSelfguidedFilterTest, DISABLED_SpeedTest) { RunSpeedTest(); }